

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O3

void __thiscall GraphTestCycleInEdgesButNotInNodes3::Run(GraphTestCycleInEdgesButNotInNodes3 *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Node *node;
  string err;
  string local_70;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar3 = g_current_test->assertion_failures_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build a b: cat c\nbuild c: cat a\n",(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  iVar4 = g_current_test->assertion_failures_;
  if (iVar3 == iVar4) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"b","");
    node = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
    bVar2 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,node,&local_50);
    testing::Test::Check
              (pTVar1,!bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x175,"scan_.RecomputeDirty(GetNode(\"b\"), &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pTVar1 = g_current_test;
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar3 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                       ,0x176,"\"dependency cycle: a -> c -> a\" == err");
    if (bVar2) goto LAB_001628ee;
    iVar4 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar4 + 1;
LAB_001628ee:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(GraphTest, CycleInEdgesButNotInNodes3) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build a b: cat c\n"
"build c: cat a\n"));
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("b"), &err));
  ASSERT_EQ("dependency cycle: a -> c -> a", err);
}